

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O2

bool __thiscall RingBuffer<65536,_float>::Feed(RingBuffer<65536,_float> *this,float *input)

{
  int iVar1;
  
  iVar1 = 0;
  if (this->writepos != 0xffff) {
    iVar1 = this->writepos + 1;
  }
  this->buffer[iVar1] = *input;
  this->writepos = iVar1;
  return true;
}

Assistant:

inline bool Feed(const T& input)
    {
        int w = (writepos == LENGTH - 1) ? 0 : (writepos + 1);
        buffer[w] = input;
        writepos = w;
        return true;
    }